

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_column_data.cpp
# Opt level: O2

idx_t __thiscall
duckdb::StructColumnData::ScanCount
          (StructColumnData *this,ColumnScanState *state,Vector *result,idx_t count,
          idx_t result_offset)

{
  vector<duckdb::ColumnScanState,_true> *this_00;
  ulong __n;
  reference pvVar1;
  idx_t iVar2;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_01;
  reference this_02;
  type this_03;
  reference this_04;
  pointer pCVar3;
  ColumnData *this_05;
  size_type __n_00;
  reference rVar4;
  
  this_00 = &state->child_states;
  this_05 = (ColumnData *)this_00;
  pvVar1 = vector<duckdb::ColumnScanState,_true>::get<true>(this_00,0);
  iVar2 = ColumnData::ScanCount(this_05,pvVar1,result,count,0);
  this_01 = StructVector::GetEntries(result);
  for (__n_00 = 1; __n = __n_00 - 1,
      __n < (ulong)((long)(this->sub_columns).
                          super_vector<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>_>_>
                          .
                          super__Vector_base<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->sub_columns).
                          super_vector<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>_>_>
                          .
                          super__Vector_base<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3); __n_00 = __n_00 + 1) {
    this_02 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
              ::get<true>(this_01,__n);
    this_03 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                        (this_02);
    rVar4 = vector<bool,_true>::get<true>(&state->scan_child_column,__n);
    if ((*rVar4._M_p & rVar4._M_mask) == 0) {
      Vector::SetVectorType(this_03,CONSTANT_VECTOR);
      ConstantVector::SetNull(this_03,true);
    }
    else {
      this_04 = vector<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_true>
                ::get<true>(&this->sub_columns,__n);
      pCVar3 = unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::
               operator->(this_04);
      pvVar1 = vector<duckdb::ColumnScanState,_true>::get<true>(this_00,__n_00);
      (*pCVar3->_vptr_ColumnData[0xc])(pCVar3,pvVar1,this_03,count,result_offset);
    }
  }
  return iVar2;
}

Assistant:

idx_t StructColumnData::ScanCount(ColumnScanState &state, Vector &result, idx_t count, idx_t result_offset) {
	auto scan_count = validity.ScanCount(state.child_states[0], result, count);
	auto &child_entries = StructVector::GetEntries(result);
	for (idx_t i = 0; i < sub_columns.size(); i++) {
		auto &target_vector = *child_entries[i];
		if (!state.scan_child_column[i]) {
			// if we are not scanning this vector - set it to NULL
			target_vector.SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(target_vector, true);
			continue;
		}
		sub_columns[i]->ScanCount(state.child_states[i + 1], target_vector, count, result_offset);
	}
	return scan_count;
}